

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void vlogprintf(char *fmt,__va_list_tag *ap)

{
  undefined8 *in_RSI;
  char *in_RDI;
  va_list lfap;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  char *local_8;
  
  local_18 = in_RSI[2];
  local_28 = *in_RSI;
  uStack_20 = in_RSI[1];
  local_8 = in_RDI;
  if (log_console != L'\0') {
    vfprintf(_stdout,in_RDI,in_RSI);
  }
  if (logfile != (FILE *)0x0) {
    vfprintf((FILE *)logfile,local_8,&local_28);
  }
  return;
}

Assistant:

static void
vlogprintf(const char *fmt, va_list ap)
{
#ifdef va_copy
	va_list lfap;
	va_copy(lfap, ap);
#endif
	if (log_console)
		vfprintf(stdout, fmt, ap);
	if (logfile != NULL)
#ifdef va_copy
		vfprintf(logfile, fmt, lfap);
	va_end(lfap);
#else
		vfprintf(logfile, fmt, ap);
#endif
}